

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArraySamplingTest::prepareTexture
          (TextureCubeMapArraySamplingTest *this,textureDefinition *texture,
          formatDefinition *texture_format,resolutionDefinition *resolution,bool mutability)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  GLenum GVar4;
  undefined4 extraout_var;
  ulong uVar5;
  int n_mipmap_levels;
  sockaddr *__addr;
  GLint face;
  GLuint GVar6;
  int cube_face;
  uint n_elements;
  GLint GVar7;
  uint uVar8;
  GLuint GVar9;
  Functions *gl;
  
  uVar8 = resolution->m_width;
  uVar1 = resolution->m_height;
  if ((int)resolution->m_height < (int)uVar8) {
    uVar1 = uVar8;
  }
  n_mipmap_levels = 1;
  if (1 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
    do {
      uVar5 = uVar5 >> 1;
      n_mipmap_levels = n_mipmap_levels + 1;
      uVar8 = (uint)uVar5;
      bVar2 = 3 < uVar1;
      uVar1 = uVar8;
    } while (bVar2);
  }
  uVar1 = resolution->m_depth;
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar3);
  textureDefinition::bind(texture,0x9009,__addr,uVar8);
  if (mutability) {
    if (n_mipmap_levels != 0) {
      GVar6 = resolution->m_width;
      GVar9 = resolution->m_height;
      GVar7 = 0;
      do {
        (*gl->texImage3D)(0x9009,GVar7,(texture_format->m_source).m_internal_format,GVar6,GVar9,
                          resolution->m_depth,0,(texture_format->m_source).m_format,
                          (texture_format->m_source).m_type,(void *)0x0);
        GVar6 = (int)GVar6 / 2;
        if ((int)GVar6 < 2) {
          GVar6 = 1;
        }
        GVar9 = (int)GVar9 / 2;
        if ((int)GVar9 < 2) {
          GVar9 = 1;
        }
        GVar7 = GVar7 + 1;
      } while (n_mipmap_levels != GVar7);
    }
  }
  else {
    (*gl->texStorage3D)(0x9009,n_mipmap_levels,(texture_format->m_source).m_internal_format,
                        resolution->m_width,resolution->m_height,resolution->m_depth);
  }
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"Failed to allocate storage for texture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                  ,0xda0);
  if (n_mipmap_levels != 0) {
    GVar6 = resolution->m_width;
    GVar9 = resolution->m_height;
    iVar3 = 0;
    do {
      if (5 < uVar1) {
        uVar8 = 0;
        do {
          cube_face = 0;
          do {
            n_elements = uVar1 / 6;
            prepareTextureFace(gl,cube_face,uVar8,iVar3,n_elements,n_mipmap_levels,
                               (texture_format->m_source).m_format,(texture_format->m_source).m_type
                               ,GVar6,GVar9);
            cube_face = cube_face + 1;
          } while (cube_face != 6);
          uVar8 = uVar8 + 1;
        } while (uVar8 != n_elements);
      }
      GVar6 = (int)GVar6 / 2;
      if ((int)GVar6 < 2) {
        GVar6 = 1;
      }
      GVar9 = (int)GVar9 / 2;
      if ((int)GVar9 < 2) {
        GVar9 = 1;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != n_mipmap_levels);
  }
  GVar4 = (texture_format->m_source).m_internal_format;
  uVar8 = GVar4 - 0x8d48;
  if (((0x3a < uVar8) || ((0x400010000000001U >> ((ulong)uVar8 & 0x3f) & 1) == 0)) &&
     (GVar4 != 0x8cac)) {
    return;
  }
  (*gl->texParameteri)(0x9009,0x2800,0x2600);
  (*gl->texParameteri)(0x9009,0x2801,0x2700);
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::prepareTexture(const textureDefinition&	texture,
													 const formatDefinition&	 texture_format,
													 const resolutionDefinition& resolution, bool mutability)
{
	static const glw::GLint n_faces = 6;

	const glw::GLint n_elements		 = resolution.m_depth / n_faces;
	const glw::GLint n_mipmap_levels = getMipmapLevelCount(resolution.m_width, resolution.m_height);
	glw::GLsizei	 texture_width   = 0;
	glw::GLsizei	 texture_height  = 0;

	/* GL functions */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	texture.bind(GL_TEXTURE_CUBE_MAP_ARRAY);

	if (false == mutability)
	{
		gl.texStorage3D(GL_TEXTURE_CUBE_MAP_ARRAY, n_mipmap_levels, texture_format.m_source.m_internal_format,
						resolution.m_width, resolution.m_height, resolution.m_depth);
	}
	else
	{
		texture_width  = resolution.m_width;
		texture_height = resolution.m_height;

		for (glw::GLint mipmap_level = 0; mipmap_level < n_mipmap_levels; ++mipmap_level)
		{
			gl.texImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, mipmap_level, texture_format.m_source.m_internal_format,
						  texture_width, texture_height, resolution.m_depth, 0 /* border */,
						  texture_format.m_source.m_format, texture_format.m_source.m_type, 0 /* data */);

			texture_width  = de::max(1, texture_width / 2);
			texture_height = de::max(1, texture_height / 2);
		}
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to allocate storage for texture");

	texture_width  = resolution.m_width;
	texture_height = resolution.m_height;

	for (glw::GLint mipmap_level = 0; mipmap_level < n_mipmap_levels; ++mipmap_level)
	{
		for (glw::GLint element_index = 0; element_index < n_elements; ++element_index)
		{
			for (glw::GLint face = 0; face < n_faces; ++face)
			{
				prepareTextureFace(gl, face, element_index, mipmap_level, n_elements, n_mipmap_levels,
								   texture_format.m_source.m_format, texture_format.m_source.m_type, texture_width,
								   texture_height);
			}
		}

		texture_width  = de::max(1, texture_width / 2);
		texture_height = de::max(1, texture_height / 2);
	}

	// not texture filterable formats
	if ((texture_format.m_source.m_internal_format == GL_RGBA32UI) ||
		(texture_format.m_source.m_internal_format == GL_RGBA32I) ||
		(texture_format.m_source.m_internal_format == GL_STENCIL_INDEX8) ||
		(texture_format.m_source.m_internal_format == GL_DEPTH_COMPONENT32F))
	{
		gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_NEAREST);
	}
}